

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall pegmatite::Context::do_parse_procs(Context *this,void *d)

{
  pointer pPVar1;
  char cVar2;
  pointer pPVar3;
  bool bVar4;
  void *local_58;
  undefined1 local_50 [16];
  code *local_40;
  code *local_38;
  
  pPVar3 = (this->matches).
           super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (this->matches).
           super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = pPVar3 == pPVar1;
  if (!bVar4) {
    do {
      (**this->delegate->_vptr_ParserDelegate)(local_50,this->delegate,pPVar3->matched_rule);
      if (local_40 == (code *)0x0) {
        __assert_fail("p",
                      "/workspace/llm4binary/github/license_c_cmakelists/CompilerTeaching[P]Pegmatite/parser.cc"
                      ,0x12f,"bool pegmatite::Context::do_parse_procs(void *) const");
      }
      local_58 = d;
      cVar2 = (*local_38)(local_50,&pPVar3->source,&local_58);
      if (local_40 != (code *)0x0) {
        (*local_40)(local_50,local_50,3);
      }
      if (cVar2 == '\0') {
        return bVar4;
      }
      pPVar3 = pPVar3 + 1;
      bVar4 = pPVar3 == pPVar1;
    } while (!bVar4);
  }
  return bVar4;
}

Assistant:

bool do_parse_procs(void *d) const
	{
		for(const auto &m : matches)
		{
			const parse_proc &p = get_parse_proc(*(m.matched_rule));
			assert(p);
			if (!p(m.source, d))
				return false;
		}

		return true;
	}